

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

uint32_t __thiscall Cache::getReplacementBlockId(Cache *this,uint32_t set_id)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint32_t *puVar6;
  uint32_t return_id;
  uint32_t uVar7;
  uint uVar8;
  long lVar9;
  pointer pBVar10;
  bool bVar11;
  
  uVar8 = (this->policy).associativity;
  uVar7 = uVar8 * set_id;
  uVar2 = uVar7 + uVar8;
  if (uVar7 < uVar2) {
    uVar4 = (ulong)uVar7;
    pBVar10 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl
              .super__Vector_impl_data._M_start + uVar4;
    do {
      if (pBVar10->valid != true) {
        return (uint32_t)uVar4;
      }
      uVar4 = uVar4 + 1;
      pBVar10 = pBVar10 + 1;
    } while (uVar2 != uVar4);
  }
  if (this->replace_policy == LRU) {
    if (uVar7 < uVar2) {
      uVar4 = (ulong)uVar7;
      puVar6 = &(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar4].last_reference;
      uVar8 = *puVar6;
      do {
        uVar1 = *puVar6;
        bVar11 = uVar1 < uVar8;
        if (bVar11) {
          uVar8 = uVar1;
        }
        if (bVar11) {
          uVar7 = (uint32_t)uVar4;
        }
        uVar4 = uVar4 + 1;
        puVar6 = puVar6 + 0xc;
      } while (uVar2 != uVar4);
    }
  }
  else if (this->replace_policy == RANDOM) {
    uVar2 = rand();
    uVar7 = uVar2 % uVar8 + uVar7;
  }
  else {
    iVar3 = 0;
    if (1 < uVar8) {
      iVar3 = 0;
      iVar5 = 1;
      uVar2 = 1;
      do {
        lVar9 = (long)(int)uVar2;
        uVar2 = this->plru_bit[set_id][lVar9] + uVar2 * 2;
        iVar3 = iVar3 + this->plru_bit[set_id][lVar9] * iVar5;
        iVar5 = iVar5 * 2;
      } while (uVar2 < uVar8);
    }
    uVar7 = uVar7 + iVar3;
  }
  return uVar7;
}

Assistant:

uint32_t Cache::getReplacementBlockId(uint32_t set_id) {
    uint32_t begin = set_id * this->policy.associativity;
    uint32_t end = begin + this->policy.associativity;
    // 空的
    for (uint32_t i = begin; i < end; i++) {
        if (!this->blocks[i].valid)
            return i;
    }

    if (this->replace_policy == Cache::ReplacePolicy::LRU) {
        // LRU
        uint32_t min_reference = this->blocks[begin].last_reference;
        uint32_t return_id = begin;
        for (uint32_t i = begin; i < end; i++) {
            if (this->blocks[i].last_reference < min_reference) {
                return_id = i;
                min_reference = this->blocks[i].last_reference;
            }
        }
        return return_id;
    } else if (this->replace_policy == Cache::ReplacePolicy::RANDOM) {
        // RANDOM
        return begin + rand() % (end - begin);
    } else {
        //PLRU
        int node, res = 0, base;
        for (node = 1, base = 1; node < this->policy.associativity; base *= 2) {
            res += base * plru_bit[set_id][node];
            node = node * 2 + plru_bit[set_id][node];
        }
        return res + begin;
    }
}